

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDInt32x4Operation::OpNeg(SIMDValue *value)

{
  _x86_SIMDValue _Var1;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar2;
  ulong uStack_d8;
  X86SIMDValue v;
  X86SIMDValue negativeOnes;
  X86SIMDValue temp;
  X86SIMDValue SIGNMASK;
  X86SIMDValue x86Result;
  SIMDValue *value_local;
  int local_28;
  int iStack_24;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(value);
  uStack_d8 = _Var1.field_0._0_8_;
  SIGNMASK.field_0.f64[0] = 2.12199579145934e-314;
  local_28 = (int)~uStack_d8;
  iStack_24 = (int)(~uStack_d8 >> 0x20);
  SIGNMASK.field_0.i32[2] = local_28 + 1;
  SIGNMASK.field_0.i32[3] = iStack_24 + 1;
  aVar2 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&SIGNMASK.field_0 + 8));
  return (SIMDValue)aVar2;
}

Assistant:

SIMDValue SIMDInt32x4Operation::OpNeg(const SIMDValue& value)
    {
        X86SIMDValue x86Result;

        X86SIMDValue SIGNMASK, temp;
        X86SIMDValue negativeOnes = { { -1, -1, -1, -1 } };
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        temp.m128i_value = _mm_andnot_si128(v.m128i_value, negativeOnes.m128i_value); // (~value) & (negative ones)
        SIGNMASK.m128i_value = _mm_set1_epi32(0x00000001);                            // set SIGNMASK to 1
        x86Result.m128i_value = _mm_add_epi32(SIGNMASK.m128i_value, temp.m128i_value);// add 4 integers respectively

        return X86SIMDValue::ToSIMDValue(x86Result);
    }